

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O1

bool __thiscall
Rml::PropertyDefinition::ParseValue(PropertyDefinition *this,Property *property,String *value)

{
  pointer pPVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  pPVar1 = (this->parsers).
           super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = (this->parsers).
          super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
          ._M_impl.super__Vector_impl_data._M_finish != pPVar1;
  if (bVar7) {
    iVar4 = (*pPVar1->parser->_vptr_PropertyParser[2])
                      (pPVar1->parser,property,value,&pPVar1->parameters);
    uVar5 = 0;
    if ((char)iVar4 == '\0') {
      lVar6 = 0x40;
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        pPVar1 = (this->parsers).
                 super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar7 = uVar5 < (ulong)(((long)(this->parsers).
                                       super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >>
                                3) * 0x6db6db6db6db6db7);
        if (!bVar7) goto LAB_0024dd7a;
        plVar2 = *(long **)((long)pPVar1 + lVar6 + -8);
        cVar3 = (**(code **)(*plVar2 + 0x10))(plVar2,property,value,(long)&pPVar1->parser + lVar6);
        lVar6 = lVar6 + 0x38;
      } while (cVar3 == '\0');
    }
    property->definition = this;
    property->parser_index = (int)uVar5;
    if (bVar7 != false) {
      return bVar7;
    }
  }
LAB_0024dd7a:
  property->unit = UNKNOWN;
  return bVar7;
}

Assistant:

bool PropertyDefinition::ParseValue(Property& property, const String& value) const
{
	for (size_t i = 0; i < parsers.size(); i++)
	{
		if (parsers[i].parser->ParseValue(property, value, parsers[i].parameters))
		{
			property.definition = this;
			property.parser_index = (int)i;
			return true;
		}
	}

	property.unit = Unit::UNKNOWN;
	return false;
}